

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImDrawListSplitter::Split(ImDrawListSplitter *this,ImDrawList *draw_list,int channels_count)

{
  undefined8 *puVar1;
  int *piVar2;
  int iVar3;
  float fVar4;
  float fVar5;
  ImDrawChannel *pIVar6;
  void *pvVar7;
  ImVec4 *pIVar8;
  undefined8 uVar9;
  void *__src;
  ImDrawChannel *pIVar10;
  void *pvVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  undefined4 uStack_34;
  
  iVar3 = (this->_Channels).Size;
  if (iVar3 < channels_count) {
    iVar13 = (this->_Channels).Capacity;
    if (iVar13 < channels_count) {
      if (iVar13 == 0) {
        iVar13 = 8;
      }
      else {
        iVar13 = iVar13 / 2 + iVar13;
      }
      if (iVar13 <= channels_count) {
        iVar13 = channels_count;
      }
      pIVar10 = (ImDrawChannel *)ImGui::MemAlloc((long)iVar13 << 5);
      pIVar6 = (this->_Channels).Data;
      if (pIVar6 != (ImDrawChannel *)0x0) {
        memcpy(pIVar10,pIVar6,(long)(this->_Channels).Size << 5);
        ImGui::MemFree((this->_Channels).Data);
      }
      (this->_Channels).Data = pIVar10;
      (this->_Channels).Capacity = iVar13;
    }
    (this->_Channels).Size = channels_count;
  }
  this->_Count = channels_count;
  pIVar6 = (this->_Channels).Data;
  (pIVar6->_IdxBuffer).Size = 0;
  (pIVar6->_IdxBuffer).Capacity = 0;
  (pIVar6->_IdxBuffer).Data = (uint *)0x0;
  (pIVar6->_CmdBuffer).Size = 0;
  (pIVar6->_CmdBuffer).Capacity = 0;
  (pIVar6->_CmdBuffer).Data = (ImDrawCmd *)0x0;
  if (1 < channels_count) {
    uVar14 = 1;
    lVar15 = 0x38;
    do {
      pIVar6 = (this->_Channels).Data;
      if ((long)uVar14 < (long)iVar3) {
        pIVar10 = pIVar6;
        if (*(int *)((long)pIVar6 + lVar15 + -0x14) < 0) {
          pvVar11 = ImGui::MemAlloc(0);
          pvVar7 = *(void **)((long)pIVar6 + lVar15 + -0x10);
          if (pvVar7 != (void *)0x0) {
            memcpy(pvVar11,pvVar7,(long)*(int *)((long)pIVar6 + lVar15 + -0x18) * 0x38);
            ImGui::MemFree(*(void **)((long)pIVar6 + lVar15 + -0x10));
          }
          *(void **)((long)pIVar6 + lVar15 + -0x10) = pvVar11;
          *(undefined4 *)((long)pIVar6 + lVar15 + -0x14) = 0;
          pIVar10 = (this->_Channels).Data;
        }
        *(undefined4 *)((long)pIVar6 + lVar15 + -0x18) = 0;
        if (*(int *)((long)pIVar10 + lVar15 + -4) < 0) {
          pvVar11 = ImGui::MemAlloc(0);
          pvVar7 = *(void **)((long)&(pIVar10->_CmdBuffer).Size + lVar15);
          if (pvVar7 != (void *)0x0) {
            memcpy(pvVar11,pvVar7,(long)*(int *)((long)pIVar10 + lVar15 + -8) << 2);
            ImGui::MemFree(*(void **)((long)&(pIVar10->_CmdBuffer).Size + lVar15));
          }
          *(void **)((long)&(pIVar10->_CmdBuffer).Size + lVar15) = pvVar11;
          *(undefined4 *)((long)pIVar10 + lVar15 + -4) = 0;
        }
        *(undefined4 *)((long)pIVar10 + lVar15 + -8) = 0;
      }
      else {
        puVar1 = (undefined8 *)((long)&(pIVar6->_CmdBuffer).Size + lVar15);
        puVar1[-1] = 0;
        *puVar1 = 0;
        puVar1[-3] = 0;
        puVar1[-2] = 0;
      }
      pIVar6 = (this->_Channels).Data;
      if (*(int *)((long)pIVar6 + lVar15 + -0x18) == 0) {
        pIVar8 = (draw_list->_ClipRectStack).Data;
        lVar12 = (long)(draw_list->_ClipRectStack).Size;
        fVar4 = pIVar8[lVar12 + -1].x;
        fVar5 = pIVar8[lVar12 + -1].w;
        uVar9 = *(undefined8 *)&pIVar8[lVar12 + -1].y;
        pvVar7 = (draw_list->_TextureIdStack).Data[(long)(draw_list->_TextureIdStack).Size + -1];
        if (*(int *)((long)pIVar6 + lVar15 + -0x14) == 0) {
          pvVar11 = ImGui::MemAlloc(0x1c0);
          __src = *(void **)((long)pIVar6 + lVar15 + -0x10);
          if (__src != (void *)0x0) {
            memcpy(pvVar11,__src,(long)*(int *)((long)pIVar6 + lVar15 + -0x18) * 0x38);
            ImGui::MemFree(*(void **)((long)pIVar6 + lVar15 + -0x10));
          }
          *(void **)((long)pIVar6 + lVar15 + -0x10) = pvVar11;
          *(undefined4 *)((long)pIVar6 + lVar15 + -0x14) = 8;
          lVar12 = (long)*(int *)((long)pIVar6 + lVar15 + -0x18);
        }
        else {
          pvVar11 = *(void **)((long)pIVar6 + lVar15 + -0x10);
          lVar12 = 0;
        }
        lVar12 = lVar12 * 0x38;
        *(ulong *)((long)pvVar11 + lVar12) = (ulong)(uint)fVar4 << 0x20;
        puVar1 = (undefined8 *)((long)pvVar11 + lVar12 + 8);
        *puVar1 = uVar9;
        puVar1[1] = CONCAT44(uStack_34,fVar5);
        *(void **)((long)pvVar11 + lVar12 + 0x18) = pvVar7;
        puVar1 = (undefined8 *)((long)pvVar11 + lVar12 + 0x20);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined8 *)((long)pvVar11 + lVar12 + 0x30) = 0;
        piVar2 = (int *)((long)pIVar6 + lVar15 + -0x18);
        *piVar2 = *piVar2 + 1;
      }
      uVar14 = uVar14 + 1;
      lVar15 = lVar15 + 0x20;
    } while ((uint)channels_count != uVar14);
  }
  return;
}

Assistant:

void ImDrawListSplitter::Split(ImDrawList* draw_list, int channels_count)
{
    IM_ASSERT(_Current == 0 && _Count <= 1);
    int old_channels_count = _Channels.Size;
    if (old_channels_count < channels_count)
        _Channels.resize(channels_count);
    _Count = channels_count;

    // Channels[] (24/32 bytes each) hold storage that we'll swap with draw_list->_CmdBuffer/_IdxBuffer
    // The content of Channels[0] at this point doesn't matter. We clear it to make state tidy in a debugger but we don't strictly need to.
    // When we switch to the next channel, we'll copy draw_list->_CmdBuffer/_IdxBuffer into Channels[0] and then Channels[1] into draw_list->CmdBuffer/_IdxBuffer
    memset(&_Channels[0], 0, sizeof(ImDrawChannel));
    for (int i = 1; i < channels_count; i++)
    {
        if (i >= old_channels_count)
        {
            IM_PLACEMENT_NEW(&_Channels[i]) ImDrawChannel();
        }
        else
        {
            _Channels[i]._CmdBuffer.resize(0);
            _Channels[i]._IdxBuffer.resize(0);
        }
        if (_Channels[i]._CmdBuffer.Size == 0)
        {
            ImDrawCmd draw_cmd;
            draw_cmd.ClipRect = draw_list->_ClipRectStack.back();
            draw_cmd.TextureId = draw_list->_TextureIdStack.back();
            _Channels[i]._CmdBuffer.push_back(draw_cmd);
        }
    }
}